

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<absl::lts_20250127::int128>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  int128 v;
  FormatConversionChar FVar1;
  bool bVar2;
  IntegralConvertResult IVar3;
  FormatConversionCharSet set;
  int128 *piVar4;
  FormatConversionSpecImpl conv;
  undefined4 in_stack_ffffffffffffff70;
  void *out_local;
  Data local_24;
  FormatConversionSpecImpl spec_local;
  Data arg_local;
  
  spec_local._0_4_ = spec._0_4_;
  local_24 = arg;
  spec_local._4_8_ = this;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
  if (FVar1 == 0x13) {
    arg_local.buf[7] = ToInt<absl::lts_20250127::int128>(spec_local._4_8_,spec.precision_);
  }
  else {
    set = ArgumentToConv<absl::lts_20250127::int128>();
    FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
    bVar2 = Contains(set,FVar1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      piVar4 = Manager<absl::lts_20250127::int128,_(absl::lts_20250127::str_format_internal::FormatArgImpl::StoragePolicy)0>
               ::Value((Data)spec_local._4_8_);
      v.v_._8_4_ = in_stack_ffffffffffffff70;
      v.v_._0_8_ = set;
      v.v_._12_4_ = local_24._0_4_;
      conv.precision_ = local_24._0_4_;
      conv._0_8_ = *(undefined8 *)((long)&piVar4->v_ + 8);
      IVar3 = str_format_internal::FormatConvertImpl
                        (*(str_format_internal **)&piVar4->v_,v,conv,
                         (FormatSinkImpl *)(ulong)(uint)spec_local._0_4_);
      arg_local.buf[7] = IVar3.value & 1;
    }
    else {
      arg_local.buf[7] = '\0';
    }
  }
  return (bool)arg_local.buf[7];
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }